

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

bool __thiscall Matrix<int>::operator!=(Matrix<int> *this,Matrix<int> *op2)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  uVar6 = (ulong)this->n;
  bVar9 = (long)uVar6 < 1;
  if (0 < (long)uVar6) {
    uVar2 = this->m;
    uVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        bVar3 = 0 < (long)(int)uVar2;
        if (*this->M[uVar7] != *op2->M[uVar7]) {
          lVar8 = 0;
          do {
            if ((ulong)uVar2 - 1 == lVar8) goto LAB_0010c4f3;
            lVar4 = lVar8 + 1;
            lVar1 = lVar8 + 1;
            lVar5 = lVar8 + 1;
            lVar8 = lVar1;
          } while (this->M[uVar7][lVar4] != op2->M[uVar7][lVar5]);
          bVar3 = lVar1 < (int)uVar2;
        }
        if (bVar3) {
          return bVar9;
        }
      }
LAB_0010c4f3:
      uVar7 = uVar7 + 1;
      bVar9 = uVar6 <= uVar7;
    } while (uVar7 != uVar6);
  }
  return bVar9;
}

Assistant:

bool operator!=(const Matrix<T>& op2) const {
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        if (M[i][j] == op2.M[i][j]) {
          return false;
        }
      }
    }
    return true;
  }